

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

dgMatrix * __thiscall
dgMeshEffect::CalculateOOBB(dgMatrix *__return_storage_ptr__,dgMeshEffect *this,dgBigVector *size)

{
  double dVar1;
  dgMatrix dVar2;
  undefined1 auVar3 [16];
  dgTemplateVector<double> dVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  dgMatrix dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  dgMatrix *pdVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  float fVar25;
  float fVar26;
  float fVar27;
  dgMatrix permuation;
  dgSphere sphere;
  undefined1 local_108 [8];
  undefined1 auStack_100 [12];
  undefined8 uStack_f4;
  undefined1 auStack_ec [8];
  float fStack_e4;
  float fStack_e0;
  undefined1 auStack_dc [20];
  dgSphere local_c8;
  dgMatrix local_70;
  
  dgPolyhedra::CalculateSphere
            (&local_c8,&this->super_dgPolyhedra,(HaF64 *)this->m_points,0x20,(dgMatrix *)0x0);
  dVar4 = (dgTemplateVector<double>)
          vcvtps2pd_avx((undefined1  [16])local_c8.m_size.super_dgTemplateVector<float>);
  auVar24._8_4_ = 0xffffffff;
  auVar24._0_8_ = 0x7fffffffffffffff;
  auVar24._12_4_ = 0x7fffffff;
  auVar24._16_8_ = 0x7fffffffffffffff;
  auVar24._24_8_ = 0x7fffffffffffffff;
  auVar24 = vpandq_avx512vl((undefined1  [32])dVar4,auVar24);
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0x7fefffffffffffff;
  auVar10._12_4_ = 0x7fefffff;
  auVar10._16_8_ = 0x7fefffffffffffff;
  auVar10._24_8_ = 0x7fefffffffffffff;
  uVar7 = vpcmpgtq_avx512vl(auVar24,auVar10);
  uVar6 = vcmpps_avx512vl((undefined1  [16])local_c8.m_size.super_dgTemplateVector<float>,
                          (undefined1  [16])0x0,3);
  if ((uVar6 & 0xf) == 0 && (uVar7 & 0xf) == 0) {
    size->super_dgTemplateVector<double> = dVar4;
    pdVar22 = dgGetIdentityMatrix();
    dVar2 = *pdVar22;
    _auStack_100 = dVar2._8_56_;
    local_108._0_4_ = 0.0;
    local_108._4_4_ = 1.0;
    dVar13 = _local_108;
    _auStack_ec = dVar2._28_36_;
    _local_108 = dVar13._0_20_;
    uStack_f4._0_4_ = 0.0;
    uStack_f4._4_4_ = 1.0;
    dVar13 = _local_108;
    auStack_dc = dVar2._44_20_;
    _local_108 = dVar13._0_40_;
    fStack_e0 = 0.0;
    _local_108 = dVar13._0_32_;
    auStack_ec._4_4_ = 0x3f800000;
    dVar1 = (size->super_dgTemplateVector<double>).m_x;
    if ((dVar1 < (size->super_dgTemplateVector<double>).m_y) ||
       (dVar1 < (size->super_dgTemplateVector<double>).m_z)) {
      uVar14 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_;
      uVar15 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_;
      uVar16 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_;
      uVar17 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_;
      uVar18 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._0_8_;
      uVar19 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._8_8_;
      uVar20 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._0_8_;
      uVar21 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._8_8_;
      do {
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._8_8_ = uVar21;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._0_8_ = uVar20;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._8_8_ = uVar19;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._0_8_ = uVar18;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_ = uVar17;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_ = uVar16;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_ = uVar15;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_ = uVar14;
        dgMatrix::operator*(&local_70,(dgMatrix *)local_108,&local_c8.super_dgMatrix);
        uVar14._0_4_ = local_70.m_front.super_dgTemplateVector<float>.m_x;
        uVar14._4_4_ = local_70.m_front.super_dgTemplateVector<float>.m_y;
        uVar15._0_4_ = local_70.m_front.super_dgTemplateVector<float>.m_z;
        uVar15._4_4_ = local_70.m_front.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_x =
             local_70.m_front.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_y =
             local_70.m_front.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_z =
             local_70.m_front.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_w =
             local_70.m_front.super_dgTemplateVector<float>.m_w;
        uVar16._0_4_ = local_70.m_up.super_dgTemplateVector<float>.m_x;
        uVar16._4_4_ = local_70.m_up.super_dgTemplateVector<float>.m_y;
        uVar17._0_4_ = local_70.m_up.super_dgTemplateVector<float>.m_z;
        uVar17._4_4_ = local_70.m_up.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_x =
             local_70.m_up.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_y =
             local_70.m_up.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_z =
             local_70.m_up.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_w =
             local_70.m_up.super_dgTemplateVector<float>.m_w;
        uVar18._0_4_ = local_70.m_right.super_dgTemplateVector<float>.m_x;
        uVar18._4_4_ = local_70.m_right.super_dgTemplateVector<float>.m_y;
        uVar19._0_4_ = local_70.m_right.super_dgTemplateVector<float>.m_z;
        uVar19._4_4_ = local_70.m_right.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_x =
             local_70.m_right.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_y =
             local_70.m_right.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_z =
             local_70.m_right.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_w =
             local_70.m_right.super_dgTemplateVector<float>.m_w;
        uVar20._0_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_x;
        uVar20._4_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_y;
        uVar21._0_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_z;
        uVar21._4_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_x =
             local_70.m_posit.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_y =
             local_70.m_posit.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_z =
             local_70.m_posit.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_w =
             local_70.m_posit.super_dgTemplateVector<float>.m_w;
        auVar3 = vcvtpd2ps_avx((undefined1  [32])size->super_dgTemplateVector<double>);
        auVar23._8_4_ = 0x7fffffff;
        auVar23._0_8_ = 0x7fffffff7fffffff;
        auVar23._12_4_ = 0x7fffffff;
        auVar23 = vpandd_avx512vl(auVar3,auVar23);
        auVar5._8_4_ = 0x7f7fffff;
        auVar5._0_8_ = 0x7f7fffff7f7fffff;
        auVar5._12_4_ = 0x7f7fffff;
        uVar6 = vpcmpgtd_avx512vl(auVar23,auVar5);
        if ((uVar6 & 0xf) != 0) {
LAB_00864076:
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x12d,"dgVector::dgVector(const dgBigVector &)");
        }
        auVar23 = vmovshdup_avx(auVar3);
        fVar25 = auVar23._0_4_;
        if (NAN(fVar25)) goto LAB_00864076;
        auVar23 = vshufpd_avx(auVar3,auVar3,1);
        auVar5 = vshufps_avx(auVar3,auVar3,0xff);
        if (NAN(auVar23._0_4_) || NAN(auVar5._0_4_)) goto LAB_00864076;
        auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * (float)local_108._4_4_)),auVar3,
                                 ZEXT416((uint)local_108._0_4_));
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * (float)uStack_f4)),auVar3,
                                 ZEXT416((uint)auStack_100._8_4_));
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fStack_e4)),auVar3,
                                 ZEXT416((uint)auStack_ec._4_4_));
        auVar5 = vfmadd231ss_fma(auVar5,auVar23,ZEXT416((uint)auStack_100._0_4_));
        auVar8 = vfmadd231ss_fma(auVar8,auVar23,ZEXT416((uint)uStack_f4._4_4_));
        auVar23 = vfmadd231ss_fma(auVar9,auVar23,ZEXT416((uint)fStack_e0));
        fVar25 = auVar5._0_4_;
        fVar26 = auVar8._0_4_;
        fVar27 = auVar23._0_4_;
        if ((((NAN(fVar27)) || (NAN(fVar26))) || (0x7f7fffff < (uint)ABS(fVar25))) ||
           ((0x7f7fffff < (uint)ABS(fVar26) || (0x7f7fffff < (uint)ABS(fVar27))))) {
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x134,
                        "dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
        }
        auVar5 = vinsertps_avx(auVar5,auVar8,0x10);
        auVar23 = vinsertps_avx(auVar5,auVar23,0x20);
        auVar3 = vblendps_avx(auVar23,auVar3,8);
        dVar4 = (dgTemplateVector<double>)vcvtps2pd_avx(auVar3);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0x7fffffffffffffff;
        auVar11._12_4_ = 0x7fffffff;
        auVar11._16_8_ = 0x7fffffffffffffff;
        auVar11._24_8_ = 0x7fffffffffffffff;
        auVar24 = vpandq_avx512vl((undefined1  [32])dVar4,auVar11);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0x7fefffffffffffff;
        auVar12._12_4_ = 0x7fefffff;
        auVar12._16_8_ = 0x7fefffffffffffff;
        auVar12._24_8_ = 0x7fefffffffffffff;
        uVar6 = vpcmpgtq_avx512vl(auVar24,auVar12);
        if (((uVar6 & 0xf) != 0) || (NAN(fVar25))) goto LAB_00864054;
        size->super_dgTemplateVector<double> = dVar4;
      } while ((fVar25 < fVar26) ||
              (uVar14 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_,
              uVar15 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_,
              uVar16 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_,
              uVar17 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_,
              uVar18 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._0_8_,
              uVar19 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._8_8_,
              uVar20 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._0_8_,
              uVar21 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._8_8_,
              fVar25 < fVar27));
    }
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_w;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_w;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_w;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_w;
    return __return_storage_ptr__;
  }
LAB_00864054:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x13f,"dgBigVector::dgBigVector(const dgVector &)");
}

Assistant:

dgMatrix dgMeshEffect::CalculateOOBB (dgBigVector& size) const
{
	dgSphere sphere (CalculateSphere (&m_points[0].m_x, sizeof (dgBigVector), NULL));
	size = sphere.m_size;

	dgMatrix permuation (dgGetIdentityMatrix());
	permuation[0][0] = hacd::HaF32 (0.0f);
	permuation[0][1] = hacd::HaF32 (1.0f);
	permuation[1][1] = hacd::HaF32 (0.0f);
	permuation[1][2] = hacd::HaF32 (1.0f);
	permuation[2][2] = hacd::HaF32 (0.0f);
	permuation[2][0] = hacd::HaF32 (1.0f);

	while ((size.m_x < size.m_y) || (size.m_x < size.m_z)) {
		sphere = permuation * sphere;
		size = permuation.UnrotateVector(size);
	}

	return sphere;
}